

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmLocalGenerator *root,cmTarget *target)

{
  bool bVar1;
  bool bVar2;
  allocator local_51;
  string local_50;
  
  bVar2 = true;
  if (target->TargetTypeValue != INTERFACE_LIBRARY) {
    std::__cxx11::string::string((string *)&local_50,"EXCLUDE_FROM_ALL",&local_51);
    bVar1 = cmTarget::GetPropertyAsBool(target,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      bVar2 = IsExcluded(this,root,target->Makefile->LocalGenerator);
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmTarget const& target) const
{
  if(target.GetType() == cmTarget::INTERFACE_LIBRARY
      || target.GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    // This target is excluded from its directory.
    return true;
    }
  else
    {
    // This target is included in its directory.  Check whether the
    // directory is excluded.
    return this->IsExcluded(root, target.GetMakefile()->GetLocalGenerator());
    }
}